

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<LargeNumbers> * __thiscall
Catch::Generators::makeGenerators<LargeNumbers,LargeNumbers>
          (Generators<LargeNumbers> *__return_storage_ptr__,Generators *this,LargeNumbers *val,
          LargeNumbers *moreGenerators)

{
  GeneratorWrapper<LargeNumbers> local_28;
  GeneratorWrapper<LargeNumbers> *local_20;
  LargeNumbers *moreGenerators_local;
  LargeNumbers *val_local;
  
  local_20 = (GeneratorWrapper<LargeNumbers> *)val;
  moreGenerators_local = (LargeNumbers *)this;
  val_local = (LargeNumbers *)__return_storage_ptr__;
  value<LargeNumbers>((Generators *)&local_28,(LargeNumbers *)this);
  makeGenerators<LargeNumbers,LargeNumbers>
            (__return_storage_ptr__,(Generators *)&local_28,local_20,moreGenerators);
  GeneratorWrapper<LargeNumbers>::~GeneratorWrapper(&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }